

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O3

void __thiscall
density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
heter_queue(heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *this,
           heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           *i_source)

{
  const_iterator source_it;
  undefined1 local_38 [32];
  
  this->m_head = (ControlBlock *)&DAT_0000ffef;
  this->m_tail = (ControlBlock *)&DAT_0000ffef;
  cbegin((const_iterator *)local_38,i_source);
  if ((ControlBlock *)local_38._0_8_ != (ControlBlock *)0x0) {
    do {
      dyn_push_copy(this,(runtime_type<> *)(local_38 + 0x18),(void *)local_38._16_8_);
      const_iterator::operator++((const_iterator *)local_38);
    } while ((ControlBlock *)local_38._0_8_ != (ControlBlock *)0x0);
  }
  return;
}

Assistant:

heter_queue(const heter_queue & i_source)
            : allocator_type(static_cast<const allocator_type &>(i_source)),
              m_head(reinterpret_cast<ControlBlock *>(s_invalid_control_block)),
              m_tail(reinterpret_cast<ControlBlock *>(s_invalid_control_block))
        {
            for (auto source_it = i_source.cbegin(); source_it != i_source.cend(); source_it++)
            {
                dyn_push_copy(source_it.complete_type(), source_it.element_ptr());
            }
        }